

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  float *pfVar2;
  bool *pbVar3;
  ImVec2 *pIVar4;
  int *piVar5;
  ImGuiNextWindowData *pIVar6;
  ImGuiNavItemData *pIVar7;
  float fVar8;
  ImGuiID IVar9;
  ImGuiInputSource IVar10;
  ImGuiID IVar11;
  ImGuiContextHook *pIVar12;
  ImFontAtlas *pIVar13;
  uint *puVar14;
  ImGuiViewportP *pIVar15;
  ImGuiTableTempData *pIVar16;
  ImGuiWindow **ppIVar17;
  ImGuiPopupData *pIVar18;
  int *piVar19;
  ImGuiGroupData *pIVar20;
  undefined1 auVar21 [16];
  ImGuiContext *pIVar22;
  ImGuiContext *pIVar23;
  ImGuiContext *pIVar24;
  ImGuiContext *pIVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  ImGuiContext *g_3;
  uint *__dest;
  ImGuiWindow *pIVar29;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar30;
  ImGuiGroupData *__dest_02;
  int i;
  uint uVar31;
  ImGuiWindow *window;
  char *pcVar32;
  byte bVar33;
  ImGuiWindow *parent;
  long lVar34;
  ImGuiWindow *pIVar35;
  ImGuiContext *g;
  int iVar36;
  ulong uVar37;
  ImRect *pIVar38;
  float *pfVar39;
  ImGuiNavLayer IVar40;
  ImFont *font;
  float *pfVar41;
  ImGuiContext *g_2;
  ImGuiWindow *old_nav_window;
  byte bVar42;
  ImGuiContext *g_5;
  long lVar43;
  ImGuiNavItemData *pIVar44;
  ImGuiContext *g_1;
  long lVar45;
  long lVar46;
  ulong uVar47;
  bool bVar48;
  uint uVar49;
  float fVar50;
  float fVar51;
  ImVec2 IVar52;
  ImVec2 IVar53;
  ImVec2 IVar54;
  ImVec2 IVar55;
  double dVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  ImVec2 IVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float local_98;
  ImRect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar22 = GImGui;
  bVar42 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0xf3d,"void ImGui::NewFrame()");
  }
  lVar43 = (long)(GImGui->Hooks).Size;
  if (0 < lVar43) {
    lVar45 = -lVar43;
    lVar46 = lVar43 << 5;
    do {
      lVar34 = (long)(pIVar22->Hooks).Size;
      if (lVar34 < lVar43) {
        pcVar32 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_001ed130;
      }
      pIVar12 = (pIVar22->Hooks).Data;
      if (*(int *)(pIVar12 + lVar46 + -0x1c) == 7) {
        memmove(pIVar12 + lVar46 + -0x20,pIVar12 + lVar46,(lVar34 + lVar45) * 0x20);
        (pIVar22->Hooks).Size = (pIVar22->Hooks).Size + -1;
      }
      lVar45 = lVar45 + 1;
      bVar27 = 1 < lVar43;
      lVar43 = lVar43 + -1;
      lVar46 = lVar46 + -0x20;
    } while (bVar27);
  }
  if (0 < (pIVar22->Hooks).Size) {
    lVar43 = 0;
    lVar46 = 0;
    do {
      pIVar12 = (pIVar22->Hooks).Data;
      if (*(int *)(pIVar12 + lVar43 + 4) == 0) {
        (**(code **)(pIVar12 + lVar43 + 0x10))(pIVar22,pIVar12 + lVar43);
      }
      lVar46 = lVar46 + 1;
      lVar43 = lVar43 + 0x20;
    } while (lVar46 < (pIVar22->Hooks).Size);
  }
  pIVar23 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bea,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1beb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bec,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bed,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if ((pIVar13->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bee,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar13->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bef,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bf0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bf1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar50 = (GImGui->Style).Alpha;
  if ((fVar50 < 0.0) || (1.0 < fVar50)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bf2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bf3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bf4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar43 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar43] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1bf6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x1bfa,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar23->SettingsLoaded == false) {
    if ((pIVar23->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x2861,"void ImGui::UpdateSettings()");
    }
    pcVar32 = (pIVar23->IO).IniFilename;
    if (pcVar32 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar32);
    }
    pIVar23->SettingsLoaded = true;
  }
  if ((0.0 < pIVar23->SettingsDirtyTimer) &&
     (fVar50 = pIVar23->SettingsDirtyTimer - (pIVar23->IO).DeltaTime,
     pIVar23->SettingsDirtyTimer = fVar50, fVar50 <= 0.0)) {
    pcVar32 = (pIVar23->IO).IniFilename;
    if (pcVar32 == (char *)0x0) {
      (pIVar23->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar32);
    }
    pIVar23->SettingsDirtyTimer = 0.0;
  }
  pIVar22->Time = (double)(pIVar22->IO).DeltaTime + pIVar22->Time;
  pIVar22->WithinFrameScope = true;
  pIVar22->FrameCount = pIVar22->FrameCount + 1;
  pIVar22->TooltipOverrideCount = 0;
  pIVar22->WindowsActiveCount = 0;
  iVar36 = (pIVar22->MenusIdSubmittedThisFrame).Capacity;
  if (iVar36 < 0) {
    uVar31 = iVar36 / 2 + iVar36;
    uVar49 = 0;
    if (0 < (int)uVar31) {
      uVar49 = uVar31;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar49 * 4,GImAllocatorUserData);
    puVar14 = (pIVar22->MenusIdSubmittedThisFrame).Data;
    if (puVar14 != (uint *)0x0) {
      memcpy(__dest,puVar14,(long)(pIVar22->MenusIdSubmittedThisFrame).Size << 2);
      puVar14 = (pIVar22->MenusIdSubmittedThisFrame).Data;
      if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
    }
    (pIVar22->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar22->MenusIdSubmittedThisFrame).Capacity = uVar49;
  }
  (pIVar22->MenusIdSubmittedThisFrame).Size = 0;
  fVar50 = (pIVar22->IO).DeltaTime;
  iVar36 = pIVar22->FramerateSecPerFrameIdx;
  pIVar22->FramerateSecPerFrameAccum =
       (fVar50 - pIVar22->FramerateSecPerFrame[iVar36]) + pIVar22->FramerateSecPerFrameAccum;
  pIVar22->FramerateSecPerFrame[iVar36] = fVar50;
  iVar28 = iVar36 + (int)((ulong)((long)(iVar36 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar22->FramerateSecPerFrameIdx = iVar36 + 1 + ((iVar28 >> 6) - (iVar28 >> 0x1f)) * -0x78;
  iVar36 = 0x77;
  if (pIVar22->FramerateSecPerFrameCount < 0x77) {
    iVar36 = pIVar22->FramerateSecPerFrameCount;
  }
  pIVar22->FramerateSecPerFrameCount = iVar36 + 1;
  uVar49 = -(uint)(0.0 < pIVar22->FramerateSecPerFrameAccum);
  (pIVar22->IO).Framerate =
       (float)(~uVar49 & 0x7f7fffff |
              (uint)(1.0 / (pIVar22->FramerateSecPerFrameAccum / (float)(iVar36 + 1))) & uVar49);
  pIVar23 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x2990,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar15 = *(GImGui->Viewports).Data;
  (pIVar15->super_ImGuiViewport).Flags = 5;
  (pIVar15->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar15->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar15->super_ImGuiViewport).Size = (pIVar23->IO).DisplaySize;
  if (0 < (pIVar23->Viewports).Size) {
    lVar43 = 0;
    do {
      pIVar15 = (pIVar23->Viewports).Data[lVar43];
      pIVar15->WorkOffsetMin = pIVar15->BuildWorkOffsetMin;
      pIVar15->WorkOffsetMax = pIVar15->BuildWorkOffsetMax;
      (pIVar15->BuildWorkOffsetMin).x = 0.0;
      (pIVar15->BuildWorkOffsetMin).y = 0.0;
      (pIVar15->BuildWorkOffsetMax).x = 0.0;
      (pIVar15->BuildWorkOffsetMax).y = 0.0;
      fVar50 = (pIVar15->WorkOffsetMin).x;
      fVar60 = (pIVar15->WorkOffsetMin).y;
      IVar59.x = (pIVar15->super_ImGuiViewport).Pos.x + fVar50;
      fVar63 = ((pIVar15->super_ImGuiViewport).Size.x - fVar50) + (pIVar15->WorkOffsetMax).x;
      IVar59.y = (pIVar15->super_ImGuiViewport).Pos.y + fVar60;
      fVar50 = ((pIVar15->super_ImGuiViewport).Size.y - fVar60) + (pIVar15->WorkOffsetMax).y;
      IVar52.y = (float)(~-(uint)(fVar50 <= 0.0) & (uint)fVar50);
      IVar52.x = (float)(~-(uint)(fVar63 <= 0.0) & (uint)fVar63);
      (pIVar15->super_ImGuiViewport).WorkPos = IVar59;
      (pIVar15->super_ImGuiViewport).WorkSize = IVar52;
      lVar43 = lVar43 + 1;
    } while (lVar43 < (pIVar23->Viewports).Size);
  }
  ((pIVar22->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar13 = (GImGui->IO).Fonts;
    if ((pIVar13->Fonts).Size < 1) {
      pcVar32 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001ed130:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                    ,0x68b,pcVar32);
    }
    font = *(pIVar13->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar22->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0xf61,"void ImGui::NewFrame()");
  }
  lVar43 = (long)(pIVar22->Viewports).Size;
  if (lVar43 < 1) {
    fVar63 = -3.4028235e+38;
    fVar50 = 3.4028235e+38;
    fVar60 = 3.4028235e+38;
    fVar62 = -3.4028235e+38;
  }
  else {
    fVar60 = 3.4028235e+38;
    lVar46 = 0;
    fVar50 = 3.4028235e+38;
    fVar61 = -3.4028235e+38;
    fVar51 = -3.4028235e+38;
    do {
      pIVar15 = (pIVar22->Viewports).Data[lVar46];
      fVar64 = (pIVar15->super_ImGuiViewport).Pos.x;
      fVar8 = (pIVar15->super_ImGuiViewport).Pos.y;
      fVar63 = (pIVar15->super_ImGuiViewport).Size.x + fVar64;
      if (fVar63 <= fVar61) {
        fVar63 = fVar61;
      }
      fVar62 = (pIVar15->super_ImGuiViewport).Size.y + fVar8;
      if (fVar62 <= fVar51) {
        fVar62 = fVar51;
      }
      if (fVar50 <= fVar64) {
        fVar64 = fVar50;
      }
      fVar50 = fVar64;
      if (fVar60 <= fVar8) {
        fVar8 = fVar60;
      }
      fVar60 = fVar8;
      lVar46 = lVar46 + 1;
      fVar61 = fVar63;
      fVar51 = fVar62;
    } while (lVar43 != lVar46);
  }
  (pIVar22->DrawListSharedData).ClipRectFullscreen.x = fVar50;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.y = fVar60;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.z = fVar63;
  (pIVar22->DrawListSharedData).ClipRectFullscreen.w = fVar62;
  fVar50 = (pIVar22->Style).CircleTessellationMaxError;
  (pIVar22->DrawListSharedData).CurveTessellationTol = (pIVar22->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar22->DrawListSharedData,fVar50);
  uVar49 = (uint)(pIVar22->Style).AntiAliasedLines;
  (pIVar22->DrawListSharedData).InitialFlags = uVar49;
  if (((pIVar22->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar22->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar22->DrawListSharedData).InitialFlags = uVar49 | 2;
  }
  if ((pIVar22->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar22->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar22->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar22->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (0 < (pIVar22->Viewports).Size) {
    lVar43 = 0;
    do {
      pIVar15 = (pIVar22->Viewports).Data[lVar43];
      (pIVar15->DrawDataP).DisplaySize.x = 0.0;
      (pIVar15->DrawDataP).DisplaySize.y = 0.0;
      (pIVar15->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar15->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar15->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar15->DrawDataP).DisplayPos.x = 0.0;
      (pIVar15->DrawDataP).DisplayPos.y = 0.0;
      (pIVar15->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar15->DrawDataP).field_0x1 = 0;
      (pIVar15->DrawDataP).CmdListsCount = 0;
      (pIVar15->DrawDataP).TotalIdxCount = 0;
      (pIVar15->DrawDataP).TotalVtxCount = 0;
      lVar43 = lVar43 + 1;
    } while (lVar43 < (pIVar22->Viewports).Size);
  }
  pIVar23 = GImGui;
  if ((pIVar22->DragDropActive != false) &&
     (IVar9 = (pIVar22->DragDropPayload).SourceId, IVar9 == pIVar22->ActiveId)) {
    if (GImGui->ActiveId == IVar9) {
      GImGui->ActiveIdIsAlive = IVar9;
    }
    if (pIVar23->ActiveIdPreviousFrame == IVar9) {
      pIVar23->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar22->HoveredIdPreviousFrame == 0) {
    pIVar22->HoveredIdTimer = 0.0;
LAB_001ea39e:
    pIVar22->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar22->HoveredId != 0) && (pIVar22->ActiveId == pIVar22->HoveredId))
  goto LAB_001ea39e;
  IVar9 = pIVar22->HoveredId;
  if ((IVar9 != 0) &&
     (pIVar22->HoveredIdTimer = (pIVar22->IO).DeltaTime + pIVar22->HoveredIdTimer,
     pIVar22->ActiveId != IVar9)) {
    pIVar22->HoveredIdNotActiveTimer = (pIVar22->IO).DeltaTime + pIVar22->HoveredIdNotActiveTimer;
  }
  pIVar22->HoveredIdPreviousFrame = IVar9;
  pIVar22->HoveredIdPreviousFrameUsingMouseWheel = pIVar22->HoveredIdUsingMouseWheel;
  pIVar22->HoveredId = 0;
  pIVar22->HoveredIdAllowOverlap = false;
  pIVar22->HoveredIdUsingMouseWheel = false;
  pIVar22->HoveredIdDisabled = false;
  IVar9 = pIVar22->ActiveId;
  if (((pIVar22->ActiveIdIsAlive != IVar9) && (IVar9 != 0)) &&
     (pIVar22->ActiveIdPreviousFrame == IVar9)) {
    ClearActiveID();
  }
  IVar9 = pIVar22->ActiveId;
  if (IVar9 != 0) {
    pIVar22->ActiveIdTimer = (pIVar22->IO).DeltaTime + pIVar22->ActiveIdTimer;
  }
  pIVar22->LastActiveIdTimer = (pIVar22->IO).DeltaTime + pIVar22->LastActiveIdTimer;
  pIVar22->ActiveIdPreviousFrame = IVar9;
  pIVar22->ActiveIdPreviousFrameWindow = pIVar22->ActiveIdWindow;
  pIVar22->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar22->ActiveIdHasBeenEditedBefore;
  pIVar22->ActiveIdIsAlive = 0;
  pIVar22->ActiveIdHasBeenEditedThisFrame = false;
  pIVar22->ActiveIdPreviousFrameIsAlive = false;
  pIVar22->ActiveIdIsJustActivated = false;
  if (IVar9 != pIVar22->TempInputId && pIVar22->TempInputId != 0) {
    pIVar22->TempInputId = 0;
  }
  if (IVar9 == 0) {
    pIVar22->ActiveIdUsingNavDirMask = 0;
    pIVar22->ActiveIdUsingNavInputMask = 0;
    pIVar22->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar22->DragDropAcceptIdPrev = pIVar22->DragDropAcceptIdCurr;
  pIVar22->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar22->DragDropAcceptIdCurr = 0;
  pIVar22->DragDropWithinSource = false;
  pIVar22->DragDropWithinTarget = false;
  pIVar22->DragDropHoldJustPressedId = 0;
  pIVar23 = GImGui;
  bVar27 = (GImGui->IO).KeyCtrl;
  uVar49 = bVar27 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar49 = (uint)bVar27;
  }
  uVar31 = uVar49 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar31 = uVar49;
  }
  uVar49 = uVar31 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar49 = uVar31;
  }
  (pIVar22->IO).KeyMods = uVar49;
  memcpy((pIVar22->IO).KeysDownDurationPrev,(pIVar22->IO).KeysDownDuration,0x800);
  lVar43 = 0x144;
  do {
    fVar50 = -1.0;
    if (*(char *)((long)(pIVar22->IO).KeyMap + lVar43 + -0x3c) == '\x01') {
      fVar60 = *(float *)((long)pIVar22 + lVar43 * 4 + -0x70);
      fVar50 = 0.0;
      if (0.0 <= fVar60) {
        fVar50 = fVar60 + (pIVar22->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar22 + lVar43 * 4 + -0x70) = fVar50;
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0x344);
  (pIVar23->IO).WantSetMousePos = false;
  pIVar23->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar23->NavWrapRequestFlags = 0;
  uVar49 = (pIVar23->IO).ConfigFlags;
  if ((uVar49 & 2) == 0) {
    bVar33 = 0;
  }
  else {
    bVar33 = (byte)(pIVar23->IO).BackendFlags & 1;
  }
  if (((bVar33 != 0) && (pIVar23->NavInputSource != ImGuiInputSource_Gamepad)) &&
     (((0.0 < (pIVar23->IO).NavInputs[0] ||
       ((0.0 < (pIVar23->IO).NavInputs[2] || (0.0 < (pIVar23->IO).NavInputs[1])))) ||
      ((0.0 < (pIVar23->IO).NavInputs[3] ||
       ((((0.0 < (pIVar23->IO).NavInputs[4] || (0.0 < (pIVar23->IO).NavInputs[5])) ||
         (0.0 < (pIVar23->IO).NavInputs[6])) || (0.0 < (pIVar23->IO).NavInputs[7])))))))) {
    pIVar23->NavInputSource = ImGuiInputSource_Gamepad;
  }
  if ((uVar49 & 1) != 0) {
    iVar36 = (pIVar23->IO).KeyMap[0xc];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[0] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[0xd];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[2] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[0xe];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[1] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[1];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[0x11] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[2];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[0x12] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[3];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) goto LAB_001ed13a;
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[0x13] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    iVar36 = (pIVar23->IO).KeyMap[4];
    if (-1 < (long)iVar36) {
      if (0x1ff < iVar36) {
LAB_001ed13a:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x121f,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar23->IO).KeysDown[iVar36] == true) {
        (pIVar23->IO).NavInputs[0x14] = 1.0;
        pIVar23->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    bVar27 = (pIVar23->IO).KeyCtrl;
    if (bVar27 == true) {
      (pIVar23->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar23->IO).KeyShift == true) {
      (pIVar23->IO).NavInputs[0xf] = 1.0;
    }
    if (((bVar27 == false) && ((pIVar23->IO).KeyAlt != false)) &&
       (((pIVar23->IO).NavInputs[0x10] = 1.0, pIVar23->NavWindowingToggleLayer == true &&
        (0 < (pIVar23->IO).InputQueueCharacters.Size)))) {
      pIVar23->NavWindowingToggleLayer = false;
    }
  }
  pfVar2 = (pIVar23->IO).NavInputsDownDuration;
  pfVar39 = pfVar2;
  pfVar41 = (pIVar23->IO).NavInputsDownDurationPrev;
  for (lVar43 = 0x15; lVar43 != 0; lVar43 = lVar43 + -1) {
    *pfVar41 = *pfVar39;
    pfVar39 = pfVar39 + (ulong)bVar42 * -2 + 1;
    pfVar41 = pfVar41 + (ulong)bVar42 * -2 + 1;
  }
  lVar43 = 0;
  do {
    fVar50 = -1.0;
    if (0.0 < (pIVar23->IO).NavInputs[lVar43]) {
      fVar50 = 0.0;
      if (0.0 <= pfVar2[lVar43]) {
        fVar50 = pfVar2[lVar43] + (pIVar23->IO).DeltaTime;
      }
    }
    pfVar2[lVar43] = fVar50;
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0x15);
  if (((pIVar23->NavInitResultId != 0) && (pIVar23->NavWindow != (ImGuiWindow *)0x0)) &&
     (SetNavID(pIVar23->NavInitResultId,pIVar23->NavLayer,0,&pIVar23->NavInitResultRectRel),
     pIVar23->NavInitRequestFromMove == true)) {
    pIVar23->NavMousePosDirty = true;
    pIVar23->NavDisableHighlight = false;
    pIVar23->NavDisableMouseHover = true;
  }
  pIVar23->NavInitRequest = false;
  pIVar23->NavInitRequestFromMove = false;
  pIVar23->NavInitResultId = 0;
  pIVar23->NavJustMovedToId = 0;
  pIVar24 = GImGui;
  if (pIVar23->NavMoveRequest == true) {
    IVar9 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar9 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId == 0) goto LAB_001eab12;
      GImGui->NavDisableHighlight = false;
    }
    else {
      pIVar7 = &GImGui->NavMoveResultOther;
      pIVar44 = &GImGui->NavMoveResultLocal;
      if (IVar9 == 0) {
        pIVar44 = pIVar7;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar9 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar9 != 0)) &&
         (IVar9 != GImGui->NavId)) {
        pIVar44 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar44 != pIVar7) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar50 = (GImGui->NavMoveResultOther).DistBox;
        fVar60 = pIVar44->DistBox;
        if (fVar60 <= fVar50) {
          if (((fVar50 != fVar60) || (NAN(fVar50) || NAN(fVar60))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar44->DistCenter < *pfVar2 || pIVar44->DistCenter == *pfVar2)) goto LAB_001ea9b3;
        }
        pIVar44 = pIVar7;
      }
LAB_001ea9b3:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar29 = pIVar44->Window, pIVar29 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x2483,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          fVar50 = (pIVar44->Window->Pos).x;
          fVar60 = (pIVar44->Window->Pos).y;
          local_88.Min.x = (pIVar44->RectRel).Min.x + fVar50;
          local_88.Max.x = fVar50 + (pIVar44->RectRel).Max.x;
          local_88.Min.y = (pIVar44->RectRel).Min.y + fVar60;
          local_88.Max.y = fVar60 + (pIVar44->RectRel).Max.y;
          IVar52 = ScrollToBringRectIntoView(pIVar44->Window,&local_88);
        }
        else {
          fVar50 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar50 = (pIVar29->ScrollMax).y;
          }
          IVar52 = (ImVec2)((ulong)(uint)((pIVar29->Scroll).y - fVar50) << 0x20);
          (pIVar29->ScrollTarget).y = fVar50;
          (pIVar29->ScrollTargetCenterRatio).y = 0.0;
          (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar50 = (pIVar44->RectRel).Min.y;
        (pIVar44->RectRel).Min.x = (pIVar44->RectRel).Min.x - IVar52.x;
        (pIVar44->RectRel).Max.x = (pIVar44->RectRel).Max.x - IVar52.x;
        (pIVar44->RectRel).Min.y = fVar50 - IVar52.y;
        (pIVar44->RectRel).Max.y = (pIVar44->RectRel).Max.y - IVar52.y;
      }
      ClearActiveID();
      pIVar24->NavWindow = pIVar44->Window;
      IVar9 = pIVar44->ID;
      if (pIVar24->NavId != IVar9) {
        pIVar24->NavJustMovedToId = IVar9;
        pIVar24->NavJustMovedToFocusScopeId = pIVar44->FocusScopeId;
        pIVar24->NavJustMovedToKeyMods = pIVar24->NavMoveRequestKeyMods;
      }
      SetNavID(IVar9,pIVar24->NavLayer,pIVar44->FocusScopeId,&pIVar44->RectRel);
      pIVar24->NavMousePosDirty = true;
      pIVar24->NavDisableHighlight = false;
    }
    pIVar24->NavDisableMouseHover = true;
  }
LAB_001eab12:
  if (pIVar23->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar23->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x2382,"void ImGui::NavUpdate()");
    }
    if (((pIVar23->NavMoveResultLocal).ID == 0) && ((pIVar23->NavMoveResultOther).ID == 0)) {
      pIVar23->NavDisableHighlight = false;
    }
    pIVar23->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar23->NavMousePosDirty == true) && (pIVar23->NavIdIsAlive == true)) {
    if (((((pIVar23->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar23->IO).BackendFlags & 4) != 0 && (pIVar23->NavDisableHighlight == false)) &&
         (pIVar23->NavDisableMouseHover == true)))) && (pIVar23->NavWindow != (ImGuiWindow *)0x0)) {
      IVar52 = NavCalcPreferredRefPos();
      (pIVar23->IO).MousePosPrev = IVar52;
      (pIVar23->IO).MousePos = IVar52;
      (pIVar23->IO).WantSetMousePos = true;
    }
    pIVar23->NavMousePosDirty = false;
  }
  pIVar23->NavIdIsAlive = false;
  pIVar23->NavJustTabbedId = 0;
  IVar40 = pIVar23->NavLayer;
  if (ImGuiNavLayer_Menu < IVar40) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x2396,"void ImGui::NavUpdate()");
  }
  pIVar29 = pIVar23->NavWindow;
  pIVar35 = pIVar29;
  if (pIVar29 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar35->RootWindow == pIVar35) || ((pIVar35->Flags & 0x14000000) != 0)) {
        if (pIVar35 != pIVar29) {
          pIVar35->NavLastChildNavWindow = pIVar29;
        }
        break;
      }
      ppIVar17 = &pIVar35->ParentWindow;
      pIVar35 = *ppIVar17;
    } while (*ppIVar17 != (ImGuiWindow *)0x0);
    if (((pIVar29 != (ImGuiWindow *)0x0) && (IVar40 == ImGuiNavLayer_Main)) &&
       (pIVar29->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar29->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar24 = GImGui;
  pIVar29 = GetTopMostPopupModal();
  if (pIVar29 != (ImGuiWindow *)0x0) {
    pIVar24->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar24->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar24->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar50 = (pIVar24->IO).DeltaTime * -10.0 + pIVar24->NavWindowingHighlightAlpha;
    fVar50 = (float)(-(uint)(0.0 <= fVar50) & (uint)fVar50);
    pIVar24->NavWindowingHighlightAlpha = fVar50;
    if ((pIVar24->DimBgRatio <= 0.0) && (fVar50 <= 0.0)) {
      pIVar24->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar29 == (ImGuiWindow *)0x0) && (pIVar24->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar27 = (pIVar24->IO).NavInputsDownDuration[3] == 0.0;
  }
  else {
    bVar27 = false;
  }
  if ((((pIVar29 == (ImGuiWindow *)0x0) && (pIVar24->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      ((pIVar24->IO).KeyCtrl == true)) &&
     ((iVar36 = (pIVar24->IO).KeyMap[0], -1 < iVar36 && (bVar26 = IsKeyPressed(iVar36,true), bVar26)
      ))) {
    bVar42 = (byte)(pIVar24->IO).ConfigFlags & 1;
  }
  else {
    bVar42 = 0;
  }
  if (bVar27 || bVar42 != 0) {
    pIVar29 = pIVar24->NavWindow;
    if (pIVar29 == (ImGuiWindow *)0x0) {
      pIVar29 = FindWindowNavFocusable((pIVar24->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar29 != (ImGuiWindow *)0x0) {
      pIVar29 = pIVar29->RootWindow;
      pIVar24->NavWindowingTargetAnim = pIVar29;
      pIVar24->NavWindowingTarget = pIVar29;
      pIVar24->NavWindowingTimer = 0.0;
      pIVar24->NavWindowingHighlightAlpha = 0.0;
      pIVar24->NavWindowingToggleLayer = (bool)(bVar42 ^ 1);
      pIVar24->NavInputSource = bVar42 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar50 = (pIVar24->IO).DeltaTime + pIVar24->NavWindowingTimer;
  pIVar24->NavWindowingTimer = fVar50;
  local_78._0_4_ = uVar49;
  if ((pIVar24->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar24->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_001eae6e:
    uVar37 = 0;
    pIVar29 = (ImGuiWindow *)0x0;
  }
  else {
    fVar60 = (fVar50 + -0.2) / 0.05;
    fVar50 = 1.0;
    if (fVar60 <= 1.0) {
      fVar50 = fVar60;
    }
    fVar50 = (float)(~-(uint)(fVar60 < 0.0) & (uint)fVar50);
    uVar49 = -(uint)(fVar50 <= pIVar24->NavWindowingHighlightAlpha);
    pIVar24->NavWindowingHighlightAlpha =
         (float)(uVar49 & (uint)pIVar24->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar50);
    fVar50 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar60 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar36 = (uint)(0.0 < fVar50) - (uint)(0.0 < fVar60);
    if (iVar36 != 0) {
      NavUpdateWindowingHighlightWindow(iVar36);
      pIVar24->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001eae6e;
    pbVar3 = &pIVar24->NavWindowingToggleLayer;
    *pbVar3 = (bool)(*pbVar3 &
                    (pIVar24->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar24->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar3 == false) {
      pIVar29 = pIVar24->NavWindowingTarget;
      uVar37 = 0;
    }
    else {
      uVar37 = (ulong)CONCAT31((int3)((uint)iVar36 >> 8),pIVar24->NavWindow != (ImGuiWindow *)0x0);
      pIVar29 = (ImGuiWindow *)0x0;
    }
    pIVar24->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar24->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar24->NavInputSource == ImGuiInputSource_Keyboard)) {
    fVar60 = (pIVar24->NavWindowingTimer + -0.2) / 0.05;
    fVar50 = 1.0;
    if (fVar60 <= 1.0) {
      fVar50 = fVar60;
    }
    fVar50 = (float)(~-(uint)(fVar60 < 0.0) & (uint)fVar50);
    uVar49 = -(uint)(fVar50 <= pIVar24->NavWindowingHighlightAlpha);
    pIVar24->NavWindowingHighlightAlpha =
         (float)(uVar49 & (uint)pIVar24->NavWindowingHighlightAlpha | ~uVar49 & (uint)fVar50);
    iVar36 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar36) && (bVar27 = IsKeyPressed(iVar36,true), bVar27)) {
      NavUpdateWindowingHighlightWindow((pIVar24->IO).KeyShift - 1 | 1);
    }
    if ((pIVar24->IO).KeyCtrl == false) {
      pIVar29 = pIVar24->NavWindowingTarget;
    }
  }
  pIVar25 = GImGui;
  fVar50 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar50 == 0.0) && (!NAN(fVar50))) {
    pIVar24->NavWindowingToggleLayer = true;
  }
  if ((((pIVar24->ActiveId == 0) || (pIVar24->ActiveIdAllowOverlap == true)) && (fVar50 < 0.0)) &&
     ((pIVar24->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar25->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar27 = IsMousePosValid(&(pIVar24->IO).MousePos);
    bVar26 = IsMousePosValid(&(pIVar24->IO).MousePosPrev);
    uVar49 = (uint)uVar37;
    uVar37 = 1;
    if (bVar26 != bVar27) {
      uVar37 = (ulong)(uVar49 & 0xff);
    }
  }
  pIVar35 = pIVar24->NavWindowingTarget;
  if ((pIVar35 != (ImGuiWindow *)0x0) && ((pIVar35->Flags & 4) == 0)) {
    local_68._0_8_ = uVar37;
    IVar10 = pIVar24->NavInputSource;
    IVar53.x = 0.0;
    IVar53.y = 0.0;
    if ((IVar10 == ImGuiInputSource_Keyboard) && ((pIVar24->IO).KeyShift == false)) {
      IVar53 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if (IVar10 == ImGuiInputSource_Gamepad) {
      IVar53 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar50 = IVar53.y;
    uVar37 = local_68._0_8_;
    if (((IVar53.x != 0.0) || (fVar50 != 0.0)) || (NAN(fVar50))) {
      fVar60 = (pIVar24->IO).DisplayFramebufferScale.x;
      fVar63 = (pIVar24->IO).DisplayFramebufferScale.y;
      if (fVar63 <= fVar60) {
        fVar60 = fVar63;
      }
      fVar60 = (float)(int)(fVar60 * (pIVar24->IO).DeltaTime * 800.0);
      pIVar35 = pIVar35->RootWindow;
      local_88.Min.x = IVar53.x * fVar60 + (pIVar35->Pos).x;
      local_88.Min.y = fVar50 * fVar60 + (pIVar35->Pos).y;
      SetWindowPos(pIVar35,&local_88.Min,1);
      if (((pIVar35->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar24->NavDisableMouseHover = true;
    }
  }
  if (pIVar29 != (ImGuiWindow *)0x0) {
    if ((pIVar24->NavWindow == (ImGuiWindow *)0x0) || (pIVar29 != pIVar24->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar24->NavDisableHighlight = false;
      pIVar24->NavDisableMouseHover = true;
      pIVar35 = pIVar29->NavLastChildNavWindow;
      if ((pIVar35 == (ImGuiWindow *)0x0) || (pIVar35->WasActive == false)) {
        pIVar35 = pIVar29;
      }
      ClosePopupsOverWindow(pIVar35,false);
      FocusWindow(pIVar35);
      if (pIVar35->NavLastIds[0] == 0) {
        NavInitWindow(pIVar35,false);
      }
      if ((pIVar35->DC).NavLayersActiveMaskNext == 2) {
        pIVar24->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar24->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((char)uVar37 != '\0') && (pIVar24->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar29 = pIVar24->NavWindow;
    pIVar35 = pIVar29;
    do {
      window = pIVar35;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar35 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar29) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar29;
    }
    pIVar24->NavDisableHighlight = false;
    pIVar24->NavDisableMouseHover = true;
    IVar40 = ImGuiNavLayer_Main;
    if (((pIVar24->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar40 = pIVar24->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar40 == ImGuiNavLayer_Menu) {
      pIVar24->NavWindow->NavLastIds[1] = 0;
    }
    NavRestoreLayer(IVar40);
  }
  auVar21 = local_78;
  if ((((local_78 & (undefined1  [16])0x1) == (undefined1  [16])0x0 & (bVar33 ^ 1)) == 0) &&
     (pIVar23->NavWindow != (ImGuiWindow *)0x0)) {
    bVar27 = (pIVar23->NavWindow->Flags & 0x40000U) == 0;
    (pIVar23->IO).NavActive = bVar27;
    if (((!bVar27) || (pIVar23->NavId == 0)) ||
       (bVar27 = true, pIVar23->NavDisableHighlight != false)) goto LAB_001eb24f;
  }
  else {
    (pIVar23->IO).NavActive = false;
LAB_001eb24f:
    bVar27 = pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar23->IO).NavVisible = bVar27;
  fVar50 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar50 == 0.0) && (!NAN(fVar50))) {
    if (pIVar23->ActiveId == 0) {
      if (pIVar23->NavLayer == ImGuiNavLayer_Main) {
        pIVar29 = pIVar23->NavWindow;
        if (((pIVar29 == (ImGuiWindow *)0x0) || (pIVar29 == pIVar29->RootWindow)) ||
           (((pIVar29->Flags & 0x4000000) != 0 ||
            (pIVar35 = pIVar29->ParentWindow, pIVar35 == (ImGuiWindow *)0x0)))) {
          iVar36 = (pIVar23->OpenPopupStack).Size;
          if ((long)iVar36 < 1) {
            if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x5000000U) != 0x1000000)) {
              pIVar29->NavLastIds[0] = 0;
            }
            pIVar23->NavId = 0;
            pIVar23->NavFocusScopeId = 0;
          }
          else if ((((pIVar23->OpenPopupStack).Data[(long)iVar36 + -1].Window)->Flags & 0x8000000)
                   == 0) {
            ClosePopupToLevel(iVar36 + -1,true);
          }
        }
        else {
          if (pIVar29->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                          ,0x23b8,"void ImGui::NavUpdate()");
          }
          fVar50 = (pIVar29->Pos).x;
          local_48 = ZEXT416((uint)fVar50);
          fVar60 = (pIVar29->Pos).y;
          local_58 = ZEXT416((uint)fVar60);
          fVar63 = (pIVar29->Size).x;
          local_68 = ZEXT416((uint)((pIVar29->Size).y + fVar60));
          FocusWindow(pIVar35);
          fVar60 = (pIVar35->Pos).x;
          fVar62 = (pIVar35->Pos).y;
          local_88.Min.x = (float)local_48._0_4_ - fVar60;
          local_88.Min.y = (float)local_58._0_4_ - fVar62;
          local_88.Max.y = (float)local_68._0_4_ - fVar62;
          local_88.Max.x = (fVar63 + fVar50) - fVar60;
          SetNavID(pIVar29->ChildId,ImGuiNavLayer_Main,0,&local_88);
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar23->NavActivateId = 0;
  pIVar23->NavActivateDownId = 0;
  pIVar23->NavActivatePressedId = 0;
  pIVar24 = GImGui;
  pIVar23->NavInputId = 0;
  IVar9 = pIVar23->NavId;
  if ((((IVar9 != 0) && (pIVar23->NavDisableHighlight == false)) &&
      (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar23->NavWindow != (ImGuiWindow *)0x0 && ((pIVar23->NavWindow->Flags & 0x40000) == 0)))) {
    fVar50 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar50) {
      bVar27 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar27 = false;
    }
    IVar11 = pIVar23->ActiveId;
    if (bVar27 && IVar11 == 0) {
      pIVar23->NavActivateId = IVar9;
    }
    if (IVar11 == 0) {
      if (0.0 < fVar50) goto LAB_001ecdcd;
    }
    else if (IVar11 == IVar9 && 0.0 < fVar50) {
LAB_001ecdcd:
      pIVar23->NavActivateDownId = IVar9;
    }
    if (IVar11 == 0) {
      if (bVar27) goto LAB_001ecde3;
    }
    else if ((bool)(bVar27 & IVar11 == IVar9)) {
LAB_001ecde3:
      pIVar23->NavActivatePressedId = IVar9;
    }
    if (((IVar11 == 0 || IVar11 == IVar9) &&
        (fVar50 = (pIVar24->IO).NavInputsDownDuration[2], fVar50 == 0.0)) && (!NAN(fVar50))) {
      pIVar23->NavInputId = IVar9;
    }
  }
  pIVar29 = pIVar23->NavWindow;
  if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) != 0)) {
    pIVar23->NavDisableHighlight = true;
  }
  IVar9 = pIVar23->NavActivateId;
  if ((IVar9 != 0) && (pIVar23->NavActivateDownId != IVar9)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x23de,"void ImGui::NavUpdate()");
  }
  pIVar23->NavMoveRequest = false;
  IVar9 = pIVar23->NavNextActivateId;
  if (IVar9 != 0) {
    pIVar23->NavInputId = IVar9;
    pIVar23->NavActivatePressedId = IVar9;
    pIVar23->NavActivateDownId = IVar9;
    pIVar23->NavActivateId = IVar9;
  }
  pIVar23->NavNextActivateId = 0;
  if (pIVar23->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar23->NavMoveDir = -1;
    pIVar23->NavMoveRequestFlags = 0;
    if (((pIVar29 != (ImGuiWindow *)0x0) && (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar29->Flags & 0x40000) == 0)) {
      uVar49 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar49 & 1) == 0) &&
         ((fVar50 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
          (fVar50 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
        pIVar23->NavMoveDir = 0;
      }
      if (((uVar49 & 2) == 0) &&
         ((fVar50 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
          (fVar50 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
        pIVar23->NavMoveDir = 1;
      }
      if (((uVar49 & 4) == 0) &&
         ((fVar50 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
          (fVar50 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
        pIVar23->NavMoveDir = 2;
      }
      if (((uVar49 & 8) == 0) &&
         ((fVar50 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar50 ||
          (fVar50 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar50)))) {
        pIVar23->NavMoveDir = 3;
      }
    }
    pIVar23->NavMoveClipDir = pIVar23->NavMoveDir;
  }
  else {
    if ((pIVar23->NavMoveDir == -1) || (pIVar23->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x23f9,"void ImGui::NavUpdate()");
    }
    if (pIVar23->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x23fa,"void ImGui::NavUpdate()");
    }
    pIVar23->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar24 = GImGui;
  fVar50 = 0.0;
  if (((((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) && (GImGui->NavMoveDir == -1))
      && (pIVar29 = GImGui->NavWindow, pIVar29 != (ImGuiWindow *)0x0)) &&
     ((((pIVar29->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar27 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar26 = false;
    bVar48 = false;
    if (bVar27) {
      bVar48 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar27 = IsKeyDown((pIVar24->IO).KeyMap[6]);
    if (bVar27) {
      bVar26 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar27 = IsKeyPressed((pIVar24->IO).KeyMap[7],true);
    if (bVar27) {
      local_78._0_4_ =
           (int)CONCAT71((int7)((ulong)GImGui >> 8),(GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0)
      ;
    }
    else {
      auVar21._12_4_ = 0;
      auVar21._0_12_ = local_78._4_12_;
      local_78 = auVar21 << 0x20;
    }
    bVar27 = IsKeyPressed((pIVar24->IO).KeyMap[8],true);
    if (bVar27) {
      bVar27 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar27 = false;
    }
    fVar50 = 0.0;
    if ((bVar48 != bVar26) || ((bool)local_78[0] != bVar27)) {
      if (((pIVar29->DC).NavLayersActiveMask == 0) && ((pIVar29->DC).NavHasScroll == true)) {
        bVar26 = IsKeyPressed((pIVar24->IO).KeyMap[5],true);
        if (bVar26) {
          fVar50 = (pIVar29->Scroll).y - ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y);
LAB_001ed097:
          (pIVar29->ScrollTarget).y = fVar50;
        }
        else {
          bVar26 = IsKeyPressed((pIVar24->IO).KeyMap[6],true);
          if (bVar26) {
            fVar50 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) + (pIVar29->Scroll).y
            ;
            goto LAB_001ed097;
          }
          if (local_78[0] == '\0') {
            if (bVar27 == false) goto LAB_001ed0aa;
            fVar50 = (pIVar29->ScrollMax).y;
            goto LAB_001ed097;
          }
          (pIVar29->ScrollTarget).y = 0.0;
        }
        (pIVar29->ScrollTargetCenterRatio).y = 0.0;
        (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_001ed0aa:
        fVar50 = 0.0;
      }
      else {
        IVar40 = pIVar24->NavLayer;
        pIVar38 = pIVar29->NavRectRel + IVar40;
        fVar50 = GImGui->FontBaseSize * pIVar29->FontWindowScale;
        if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
          fVar50 = fVar50 * pIVar29->ParentWindow->FontWindowScale;
        }
        fVar50 = (pIVar29->NavRectRel[IVar40].Max.y - pIVar29->NavRectRel[IVar40].Min.y) +
                 (((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) - fVar50);
        fVar50 = (float)(~-(uint)(fVar50 <= 0.0) & (uint)fVar50);
        bVar26 = IsKeyPressed((pIVar24->IO).KeyMap[5],true);
        if (bVar26) {
          fVar50 = -fVar50;
          pIVar24->NavMoveDir = 3;
          pIVar24->NavMoveClipDir = 2;
          pIVar24->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar26 = IsKeyPressed((pIVar24->IO).KeyMap[6],true);
          if (!bVar26) {
            if (local_78[0] == '\0') {
              fVar50 = 0.0;
              if (bVar27 != false) {
                fVar60 = ((pIVar29->ScrollMax).y + (pIVar29->SizeFull).y) - (pIVar29->Scroll).y;
                pIVar29->NavRectRel[IVar40].Max.y = fVar60;
                pIVar29->NavRectRel[IVar40].Min.y = fVar60;
                fVar60 = (pIVar38->Min).x;
                pIVar4 = &pIVar29->NavRectRel[IVar40].Max;
                if (pIVar4->x <= fVar60 && fVar60 != pIVar4->x) {
                  pIVar29->NavRectRel[IVar40].Max.x = 0.0;
                  (pIVar38->Min).x = 0.0;
                }
                pIVar24->NavMoveDir = 2;
                pIVar24->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001eb4f6;
            }
            fVar50 = -(pIVar29->Scroll).y;
            pIVar29->NavRectRel[IVar40].Max.y = fVar50;
            pIVar29->NavRectRel[IVar40].Min.y = fVar50;
            fVar50 = (pIVar38->Min).x;
            pIVar4 = &pIVar29->NavRectRel[IVar40].Max;
            if (pIVar4->x <= fVar50 && fVar50 != pIVar4->x) {
              pIVar29->NavRectRel[IVar40].Max.x = 0.0;
              (pIVar38->Min).x = 0.0;
            }
            pIVar24->NavMoveDir = 3;
            pIVar24->NavMoveRequestFlags = 0x50;
            goto LAB_001ed0aa;
          }
          pIVar24->NavMoveDir = 2;
          pIVar24->NavMoveClipDir = 3;
          pIVar24->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001eb4f6:
  uVar49 = pIVar23->NavMoveDir;
  if (uVar49 != 0xffffffff) {
    pIVar23->NavMoveRequest = true;
    pIVar23->NavMoveRequestKeyMods = (pIVar23->IO).KeyMods;
    pIVar23->NavMoveDirLast = uVar49;
  }
  bVar27 = pIVar23->NavMoveRequest;
  if ((bVar27 == true) && (pIVar23->NavId == 0)) {
    pIVar23->NavInitRequest = true;
    pIVar23->NavInitRequestFromMove = true;
    pIVar23->NavInitResultId = 0;
    pIVar23->NavDisableHighlight = false;
  }
  pIVar24 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar3 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar3;
    if (*pbVar3 != false) goto LAB_001eb580;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001eb580:
    if (pIVar24->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x22e0,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar29 = pIVar23->NavWindow;
  if (((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 0x40000) == 0)) &&
     (pIVar23->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = pIVar24->FontBaseSize * pIVar29->FontWindowScale;
    if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
      fVar60 = fVar60 * pIVar29->ParentWindow->FontWindowScale;
    }
    fVar60 = (float)(int)(fVar60 * 100.0 * (pIVar23->IO).DeltaTime + 0.5);
    local_78 = ZEXT416((uint)fVar60);
    if (((pIVar29->DC).NavLayersActiveMask == 0) && (((pIVar29->DC).NavHasScroll & bVar27) == 1)) {
      if (uVar49 < 2) {
        (pIVar29->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_00345b74 + (ulong)(uVar49 == 0) * 4) * fVar60 +
                         (pIVar29->Scroll).x);
        (pIVar29->ScrollTargetCenterRatio).x = 0.0;
        (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar49 & 0xfffffffe) == 2) {
        (pIVar29->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_00345b74 + (ulong)(uVar49 == 2) * 4) * fVar60 +
                         (pIVar29->Scroll).y);
        (pIVar29->ScrollTargetCenterRatio).y = 0.0;
        (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar52 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar60 = IVar52.x;
    fVar63 = IVar52.y;
    if (((fVar60 != 0.0) || (NAN(fVar60))) && (pIVar29->ScrollbarX == true)) {
      (pIVar29->ScrollTarget).x = (float)(int)(fVar60 * (float)local_78._0_4_ + (pIVar29->Scroll).x)
      ;
      (pIVar29->ScrollTargetCenterRatio).x = 0.0;
      (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar63 != 0.0) || (NAN(fVar63))) {
      (pIVar29->ScrollTarget).y = (float)(int)(fVar63 * (float)local_78._0_4_ + (pIVar29->Scroll).y)
      ;
      (pIVar29->ScrollTargetCenterRatio).y = 0.0;
      (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar23->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar23->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar23->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar23->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar23->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar23->NavMoveResultLocal).ID = 0;
  (pIVar23->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar23->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar23->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar23->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar23->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar23->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar23->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar23->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar23->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar23->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar23->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar23->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar23->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar23->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar23->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar23->NavMoveResultOther).ID = 0;
  (pIVar23->NavMoveResultOther).FocusScopeId = 0;
  (pIVar23->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar23->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar23->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar23->NavMoveResultOther).RectRel.Max.y = 0.0;
  (pIVar23->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar23->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar23->NavMoveResultOther).DistCenter = 3.4028235e+38;
  if (((bVar27 != false) && (pIVar23->NavInputSource == ImGuiInputSource_Gamepad)) &&
     (pIVar23->NavLayer == ImGuiNavLayer_Main)) {
    fVar60 = (pIVar29->Pos).x;
    fVar63 = (pIVar29->Pos).y;
    local_88.Min.x = ((pIVar29->InnerRect).Min.x - fVar60) + -1.0;
    fVar62 = ((pIVar29->InnerRect).Min.y - fVar63) + -1.0;
    local_88.Min.y = fVar62;
    fVar61 = ((pIVar29->InnerRect).Max.x - fVar60) + 1.0;
    fVar60 = ((pIVar29->InnerRect).Max.y - fVar63) + 1.0;
    local_88.Max.y = fVar60;
    local_88.Max.x = fVar61;
    if (((pIVar29->NavRectRel[0].Min.x < local_88.Min.x) || (pIVar29->NavRectRel[0].Min.y < fVar62))
       || ((fVar61 < pIVar29->NavRectRel[0].Max.x || (fVar60 < pIVar29->NavRectRel[0].Max.y)))) {
      fVar63 = pIVar24->FontBaseSize * pIVar29->FontWindowScale;
      if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
        fVar63 = fVar63 * pIVar29->ParentWindow->FontWindowScale;
      }
      fVar63 = fVar63 * 0.5;
      fVar51 = fVar61 - local_88.Min.x;
      if (fVar63 <= fVar61 - local_88.Min.x) {
        fVar51 = fVar63;
      }
      fVar64 = fVar60 - fVar62;
      if (fVar63 <= fVar60 - fVar62) {
        fVar64 = fVar63;
      }
      local_88.Min.y = fVar62 + fVar64;
      local_88.Min.x = local_88.Min.x + fVar51;
      local_88.Max.y = fVar60 - fVar64;
      local_88.Max.x = fVar61 - fVar51;
      ImRect::ClipWithFull(pIVar29->NavRectRel,&local_88);
      pIVar23->NavId = 0;
      pIVar23->NavFocusScopeId = 0;
    }
  }
  pIVar29 = pIVar23->NavWindow;
  if (pIVar29 != (ImGuiWindow *)0x0) {
    IVar40 = pIVar23->NavLayer;
    fVar60 = pIVar29->NavRectRel[IVar40].Min.x;
    fVar63 = pIVar29->NavRectRel[IVar40].Max.x;
    if (fVar60 <= fVar63) {
      fVar62 = pIVar29->NavRectRel[IVar40].Min.y;
      fVar61 = pIVar29->NavRectRel[IVar40].Max.y;
      if (fVar62 <= fVar61) goto LAB_001eb975;
    }
  }
  fVar62 = 0.0;
  fVar60 = 0.0;
  fVar63 = 0.0;
  fVar61 = 0.0;
LAB_001eb975:
  if (pIVar29 == (ImGuiWindow *)0x0) {
    fVar62 = 0.0;
    fVar60 = 0.0;
    fVar61 = 0.0;
    fVar63 = 0.0;
  }
  else {
    fVar51 = (pIVar29->Pos).x;
    fVar64 = (pIVar29->Pos).y;
    fVar60 = fVar60 + fVar51;
    fVar62 = fVar62 + fVar64;
    fVar63 = fVar63 + fVar51;
    fVar61 = fVar61 + fVar64;
  }
  (pIVar23->NavScoringRect).Min.y = fVar62 + fVar50;
  (pIVar23->NavScoringRect).Max.y = fVar61 + fVar50;
  fVar51 = fVar60 + 1.0;
  if (fVar63 <= fVar60 + 1.0) {
    fVar51 = fVar63;
  }
  (pIVar23->NavScoringRect).Min.x = fVar51;
  (pIVar23->NavScoringRect).Max.x = fVar51;
  if (fVar61 + fVar50 < fVar62 + fVar50) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x2449,"void ImGui::NavUpdate()");
  }
  pIVar23->NavScoringCount = 0;
  pIVar23 = GImGui;
  pIVar4 = &(GImGui->IO).MousePos;
  bVar27 = IsMousePosValid(pIVar4);
  if (bVar27) {
    IVar54.x = (float)(int)(pIVar23->IO).MousePos.x;
    IVar54.y = (float)(int)(pIVar23->IO).MousePos.y;
    pIVar23->LastValidMousePos = IVar54;
    (pIVar23->IO).MousePos = IVar54;
  }
  bVar27 = IsMousePosValid(pIVar4);
  if ((bVar27) && (bVar27 = IsMousePosValid(&(pIVar23->IO).MousePosPrev), bVar27)) {
    IVar55.x = (pIVar23->IO).MousePos.x - (pIVar23->IO).MousePosPrev.x;
    IVar55.y = (pIVar23->IO).MousePos.y - (pIVar23->IO).MousePosPrev.y;
    (pIVar23->IO).MouseDelta = IVar55;
  }
  else {
    (pIVar23->IO).MouseDelta.x = 0.0;
    (pIVar23->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar23->IO).MouseDelta.x != 0.0) || (fVar50 = (pIVar23->IO).MouseDelta.y, fVar50 != 0.0))
     || (NAN(fVar50))) {
    pIVar23->NavDisableMouseHover = false;
  }
  (pIVar23->IO).MousePosPrev = (pIVar23->IO).MousePos;
  lVar43 = -5;
  do {
    fVar50 = -1.0;
    bVar27 = (pIVar23->IO).MouseDown[lVar43 + 5];
    if (bVar27 == true) {
      pfVar2 = (pIVar23->IO).MouseDownDurationPrev + lVar43;
      bVar26 = *pfVar2 <= 0.0 && *pfVar2 != 0.0;
    }
    else {
      bVar26 = false;
    }
    (pIVar23->IO).MouseDoubleClicked[lVar43] = bVar26;
    if (bVar27 == false) {
      bVar48 = 0.0 <= (pIVar23->IO).MouseDownDurationPrev[lVar43];
    }
    else {
      bVar48 = false;
    }
    (pIVar23->IO).MouseDownOwned[lVar43] = bVar48;
    fVar60 = (pIVar23->IO).MouseDownDurationPrev[lVar43];
    (&(pIVar23->IO).MouseDragMaxDistanceAbs[0].x)[lVar43] = fVar60;
    if ((bVar27 != false) && (fVar50 = 0.0, 0.0 <= fVar60)) {
      fVar50 = fVar60 + (pIVar23->IO).DeltaTime;
    }
    (pIVar23->IO).MouseDownDurationPrev[lVar43] = fVar50;
    (pIVar23->IO).MouseReleased[lVar43] = false;
    if (bVar26 == false) {
      if (bVar27 != false) {
        bVar27 = IsMousePosValid(pIVar4);
        fVar50 = 0.0;
        fVar60 = 0.0;
        if (bVar27) {
          fVar50 = (pIVar23->IO).MousePos.x -
                   *(float *)((long)(pIVar23->IO).MouseClickedTime + lVar43 * 8 + -4);
          fVar60 = (pIVar23->IO).MousePos.y - *(float *)((pIVar23->IO).MouseClickedTime + lVar43);
        }
        fVar63 = (pIVar23->IO).KeysDownDuration[lVar43];
        fVar62 = -fVar60;
        if (-fVar60 <= fVar60) {
          fVar62 = fVar60;
        }
        fVar60 = fVar50 * fVar50 + fVar60 * fVar60;
        uVar49 = -(uint)(fVar60 <= fVar63);
        (pIVar23->IO).KeysDownDuration[lVar43] =
             (float)(~uVar49 & (uint)fVar60 | (uint)fVar63 & uVar49);
        fVar60 = -fVar50;
        if (-fVar50 <= fVar50) {
          fVar60 = fVar50;
        }
        fVar50 = (pIVar23->IO).MouseDragMaxDistanceSqr[lVar43 * 2];
        fVar63 = (pIVar23->IO).MouseDragMaxDistanceSqr[lVar43 * 2 + 1];
        uVar49 = -(uint)(fVar60 <= fVar50);
        (pIVar23->IO).MouseDragMaxDistanceSqr[lVar43 * 2] =
             (float)(~uVar49 & (uint)fVar60 | (uint)fVar50 & uVar49);
        uVar49 = -(uint)(fVar62 <= fVar63);
        (pIVar23->IO).MouseDragMaxDistanceSqr[lVar43 * 2 + 1] =
             (float)(~uVar49 & (uint)fVar62 | (uint)fVar63 & uVar49);
      }
    }
    else {
      dVar56 = pIVar23->Time;
      if ((float)(dVar56 - *(double *)((pIVar23->IO).MouseClicked + lVar43 * 8)) <
          (pIVar23->IO).MouseDoubleClickTime) {
        bVar27 = IsMousePosValid(pIVar4);
        fVar50 = 0.0;
        fVar60 = 0.0;
        if (bVar27) {
          fVar50 = (pIVar23->IO).MousePos.x -
                   *(float *)((long)(pIVar23->IO).MouseClickedTime + lVar43 * 8 + -4);
          fVar60 = (pIVar23->IO).MousePos.y - *(float *)((pIVar23->IO).MouseClickedTime + lVar43);
        }
        fVar63 = (pIVar23->IO).MouseDoubleClickMaxDist;
        if (fVar50 * fVar50 + fVar60 * fVar60 < fVar63 * fVar63) {
          (pIVar23->IO).MouseReleased[lVar43] = true;
        }
        dVar56 = (double)((pIVar23->IO).MouseDoubleClickTime * -2.0);
      }
      *(double *)((pIVar23->IO).MouseClicked + lVar43 * 8) = dVar56;
      *(ImVec2 *)((long)(pIVar23->IO).MouseClickedTime + lVar43 * 8 + -4) = (pIVar23->IO).MousePos;
      *(bool *)((long)(pIVar23->IO).MouseDownDuration + lVar43 + -3) =
           (pIVar23->IO).MouseReleased[lVar43];
      pfVar2 = (pIVar23->IO).MouseDragMaxDistanceSqr + lVar43 * 2;
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      (pIVar23->IO).KeysDownDuration[lVar43] = 0.0;
    }
    if (((pIVar23->IO).MouseDown[lVar43 + 5] == false) &&
       ((pIVar23->IO).MouseDownOwned[lVar43] == false)) {
      *(undefined1 *)((long)(pIVar23->IO).MouseDownDuration + lVar43 + -3) = 0;
    }
    if ((pIVar23->IO).MouseDoubleClicked[lVar43] == true) {
      pIVar23->NavDisableMouseHover = false;
    }
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar29 = GetTopMostPopupModal();
  if ((pIVar29 != (ImGuiWindow *)0x0) ||
     ((pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar22->NavWindowingHighlightAlpha)))) {
    fVar50 = (pIVar22->IO).DeltaTime * 6.0 + pIVar22->DimBgRatio;
    if (1.0 <= fVar50) {
      fVar50 = 1.0;
    }
    pIVar22->DimBgRatio = fVar50;
  }
  else {
    fVar50 = (pIVar22->IO).DeltaTime * -10.0 + pIVar22->DimBgRatio;
    pIVar22->DimBgRatio = (float)(-(uint)(0.0 <= fVar50) & (uint)fVar50);
  }
  pIVar22->MouseCursor = 0;
  pIVar22->WantTextInputNextFrame = -1;
  pIVar22->WantCaptureMouseNextFrame = -1;
  pIVar22->WantCaptureKeyboardNextFrame = -1;
  (pIVar22->PlatformImePos).x = 1.0;
  pIVar23 = GImGui;
  (pIVar22->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar27 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar27) &&
       (fVar50 = (pIVar23->IO).MouseDragThreshold,
       fVar60 = (pIVar23->IO).MousePos.x - (pIVar23->WheelingWindowRefMousePos).x,
       fVar63 = (pIVar23->IO).MousePos.y - (pIVar23->WheelingWindowRefMousePos).y,
       fVar50 * fVar50 < fVar60 * fVar60 + fVar63 * fVar63)) {
      pIVar23->WheelingWindowTimer = 0.0;
    }
    if (pIVar23->WheelingWindowTimer <= 0.0) {
      pIVar23->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar23->WheelingWindowTimer = 0.0;
    }
  }
  pIVar24 = GImGui;
  fVar50 = (pIVar23->IO).MouseWheel;
  if ((((((fVar50 != 0.0) || (NAN(fVar50))) || (fVar60 = (pIVar23->IO).MouseWheelH, fVar60 != 0.0))
       || (NAN(fVar60))) &&
      ((pIVar23->ActiveId == 0 || (pIVar23->ActiveIdUsingMouseWheel == false)))) &&
     ((pIVar23->HoveredIdPreviousFrame == 0 ||
      (pIVar23->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
    pIVar29 = pIVar23->WheelingWindow;
    if (pIVar29 == (ImGuiWindow *)0x0) {
      pIVar29 = pIVar23->HoveredWindow;
    }
    if ((pIVar29 != (ImGuiWindow *)0x0) && (pIVar29->Collapsed == false)) {
      if (((fVar50 == 0.0) && (!NAN(fVar50))) ||
         (((pIVar23->IO).KeyCtrl != true || ((pIVar23->IO).FontAllowUserScaling != true)))) {
        if ((pIVar23->IO).KeyCtrl == false) {
          if ((pIVar23->IO).KeyShift == true) {
            bVar42 = (pIVar23->IO).ConfigMacOSXBehaviors ^ 1;
          }
          else {
            bVar42 = 0;
          }
          fVar60 = 0.0;
          if (bVar42 == 0) {
            fVar60 = fVar50;
          }
          fVar50 = *(float *)((pIVar23->IO).MouseDown + (ulong)(bVar42 ^ 1) * 4 + 8);
          if ((fVar60 != 0.0) || (NAN(fVar60))) {
            if (GImGui->WheelingWindow != pIVar29) {
              GImGui->WheelingWindow = pIVar29;
              pIVar24->WheelingWindowRefMousePos = (pIVar24->IO).MousePos;
              pIVar24->WheelingWindowTimer = 2.0;
            }
            while ((uVar49 = pIVar29->Flags, (uVar49 >> 0x18 & 1) != 0 &&
                   (((uVar49 & 0x210) == 0x10 ||
                    ((fVar63 = (pIVar29->ScrollMax).y, fVar63 == 0.0 && (!NAN(fVar63)))))))) {
              pIVar29 = pIVar29->ParentWindow;
            }
            if ((uVar49 & 0x210) == 0) {
              fVar63 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) * 0.67;
              fVar62 = pIVar24->FontBaseSize * pIVar29->FontWindowScale;
              if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
                fVar62 = fVar62 * pIVar29->ParentWindow->FontWindowScale;
              }
              fVar61 = fVar62 * 5.0;
              if (fVar63 <= fVar62 * 5.0) {
                fVar61 = fVar63;
              }
              (pIVar29->ScrollTarget).y = (pIVar29->Scroll).y - fVar60 * (float)(int)fVar61;
              (pIVar29->ScrollTargetCenterRatio).y = 0.0;
              (pIVar29->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
          pIVar23 = GImGui;
          if ((fVar50 != 0.0) || (NAN(fVar50))) {
            if (GImGui->WheelingWindow != pIVar29) {
              GImGui->WheelingWindow = pIVar29;
              pIVar23->WheelingWindowRefMousePos = (pIVar23->IO).MousePos;
              pIVar23->WheelingWindowTimer = 2.0;
            }
            while ((uVar49 = pIVar29->Flags, (uVar49 >> 0x18 & 1) != 0 &&
                   (((uVar49 & 0x210) == 0x10 ||
                    ((fVar60 = (pIVar29->ScrollMax).x, fVar60 == 0.0 && (!NAN(fVar60)))))))) {
              pIVar29 = pIVar29->ParentWindow;
            }
            if ((uVar49 & 0x210) == 0) {
              fVar60 = ((pIVar29->InnerRect).Max.x - (pIVar29->InnerRect).Min.x) * 0.67;
              fVar63 = pIVar23->FontBaseSize * pIVar29->FontWindowScale;
              if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
                fVar63 = fVar63 * pIVar29->ParentWindow->FontWindowScale;
              }
              fVar62 = fVar63 + fVar63;
              if (fVar60 <= fVar63 + fVar63) {
                fVar62 = fVar60;
              }
              (pIVar29->ScrollTarget).x = (pIVar29->Scroll).x - fVar50 * (float)(int)fVar62;
              (pIVar29->ScrollTargetCenterRatio).x = 0.0;
              (pIVar29->ScrollTargetEdgeSnapDist).x = 0.0;
            }
          }
        }
      }
      else {
        if (GImGui->WheelingWindow != pIVar29) {
          GImGui->WheelingWindow = pIVar29;
          pIVar24->WheelingWindowRefMousePos = (pIVar24->IO).MousePos;
          pIVar24->WheelingWindowTimer = 2.0;
        }
        fVar50 = pIVar29->FontWindowScale;
        fVar63 = (pIVar23->IO).MouseWheel * 0.1 + fVar50;
        fVar60 = 2.5;
        if (fVar63 <= 2.5) {
          fVar60 = fVar63;
        }
        fVar60 = (float)(-(uint)(fVar63 < 0.5) & 0x3f000000 | ~-(uint)(fVar63 < 0.5) & (uint)fVar60)
        ;
        pIVar29->FontWindowScale = fVar60;
        if (pIVar29 == pIVar29->RootWindow) {
          fVar60 = fVar60 / fVar50;
          fVar50 = (pIVar29->Size).x;
          fVar63 = (pIVar29->Size).y;
          fVar62 = (pIVar29->Pos).x;
          fVar61 = (pIVar29->Pos).y;
          local_88.Min.y =
               (((pIVar23->IO).MousePos.y - fVar61) * (1.0 - fVar60) * fVar63) / fVar63 + fVar61;
          local_88.Min.x =
               (((pIVar23->IO).MousePos.x - fVar62) * (1.0 - fVar60) * fVar50) / fVar50 + fVar62;
          SetWindowPos(pIVar29,&local_88.Min,0);
          IVar57.x = (float)(int)((pIVar29->Size).x * fVar60);
          IVar57.y = (float)(int)((pIVar29->Size).y * fVar60);
          pIVar29->Size = IVar57;
          IVar58.x = (float)(int)((pIVar29->SizeFull).x * fVar60);
          IVar58.y = (float)(int)(fVar60 * (pIVar29->SizeFull).y);
          pIVar29->SizeFull = IVar58;
        }
      }
    }
  }
  pIVar23 = GImGui;
  pIVar29 = GImGui->NavWindow;
  if ((((pIVar29 == (ImGuiWindow *)0x0) || (pIVar29->Active != true)) ||
      ((pIVar29->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar36 = (GImGui->IO).KeyMap[0], iVar36 < 0)))) {
    bVar27 = false;
  }
  else {
    bVar27 = IsKeyPressed(iVar36,true);
  }
  pIVar23->TabFocusPressed = bVar27;
  if ((bVar27 != false) && (pIVar23->ActiveId == 0)) {
    pIVar23->TabFocusRequestNextWindow = pIVar23->NavWindow;
    pIVar23->TabFocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar23->NavId == 0) || (iVar36 = pIVar23->NavIdTabCounter, iVar36 == 0x7fffffff)) {
      iVar36 = 0;
    }
    pIVar23->TabFocusRequestNextCounterTabStop = iVar36 - (uint)(pIVar23->IO).KeyShift;
  }
  pIVar23->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar23->TabFocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar23->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar29 = pIVar23->TabFocusRequestNextWindow;
  if (pIVar29 != (ImGuiWindow *)0x0) {
    pIVar23->TabFocusRequestCurrWindow = pIVar29;
    if ((pIVar23->TabFocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar36 = (pIVar29->DC).FocusCounterRegular, iVar36 != -1)) {
      pIVar23->TabFocusRequestCurrCounterRegular =
           (pIVar23->TabFocusRequestNextCounterRegular + iVar36 + 1) % (iVar36 + 1);
    }
    if ((pIVar23->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar36 = (pIVar29->DC).FocusCounterTabStop, iVar36 != -1)) {
      pIVar23->TabFocusRequestCurrCounterTabStop =
           (pIVar23->TabFocusRequestNextCounterTabStop + iVar36 + 1) % (iVar36 + 1);
    }
    pIVar23->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar23->TabFocusRequestNextCounterRegular = 0x7fffffff;
    pIVar23->TabFocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar23->NavIdTabCounter = 0x7fffffff;
  if ((pIVar22->Windows).Size < (pIVar22->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0xfd0,"void ImGui::NewFrame()");
  }
  local_98 = 3.4028235e+38;
  if ((pIVar22->GcCompactAll == false) &&
     (fVar50 = (pIVar22->IO).ConfigMemoryCompactTimer, 0.0 <= fVar50)) {
    local_98 = (float)pIVar22->Time - fVar50;
  }
  uVar49 = (pIVar22->Windows).Size;
  uVar37 = (ulong)uVar49;
  if (uVar49 != 0) {
    uVar47 = 0;
    do {
      if ((long)(int)uVar37 <= (long)uVar47) {
        pcVar32 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001ed130;
      }
      pIVar29 = (pIVar22->Windows).Data[uVar47];
      bVar27 = pIVar29->Active;
      pIVar29->WasActive = bVar27;
      pIVar29->BeginCount = 0;
      pIVar29->Active = false;
      pIVar29->WriteAccessed = false;
      if (((bVar27 == false) && (pIVar29->MemoryCompacted == false)) &&
         (pIVar29->LastTimeActive <= local_98 && local_98 != pIVar29->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar29);
      }
      uVar47 = uVar47 + 1;
      uVar37 = (ulong)(uint)(pIVar22->Windows).Size;
    } while (uVar47 != uVar37);
  }
  if (0 < (pIVar22->TablesLastTimeActive).Size) {
    lVar43 = 0;
    lVar46 = 0;
    do {
      fVar50 = (pIVar22->TablesLastTimeActive).Data[lVar46];
      if ((0.0 <= fVar50) && (fVar50 < local_98)) {
        if ((pIVar22->Tables).Buf.Size <= lVar46) {
          pcVar32 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_001ed130;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar22->Tables).Buf.Data)->ID + lVar43));
      }
      lVar46 = lVar46 + 1;
      lVar43 = lVar43 + 0x1e8;
    } while (lVar46 < (pIVar22->TablesLastTimeActive).Size);
  }
  if (0 < (pIVar22->TablesTempDataStack).Size) {
    lVar43 = 0;
    lVar46 = 0;
    do {
      pIVar16 = (pIVar22->TablesTempDataStack).Data;
      fVar50 = *(float *)((long)&pIVar16->LastTimeActive + lVar43);
      if ((0.0 <= fVar50) && (fVar50 < local_98)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar16->TableIndex + lVar43));
      }
      lVar46 = lVar46 + 1;
      lVar43 = lVar43 + 0x90;
    } while (lVar46 < (pIVar22->TablesTempDataStack).Size);
  }
  if (pIVar22->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar22->GcCompactAll = false;
  if ((pIVar22->NavWindow != (ImGuiWindow *)0x0) && (pIVar22->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar36 = (pIVar22->CurrentWindowStack).Capacity;
  if (iVar36 < 0) {
    uVar49 = iVar36 / 2 + iVar36;
    uVar37 = 0;
    if (0 < (int)uVar49) {
      uVar37 = (ulong)uVar49;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar37 * 8,GImAllocatorUserData);
    ppIVar17 = (pIVar22->CurrentWindowStack).Data;
    if (ppIVar17 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar17,(long)(pIVar22->CurrentWindowStack).Size << 3);
      ppIVar17 = (pIVar22->CurrentWindowStack).Data;
      if ((ppIVar17 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar17,GImAllocatorUserData);
    }
    (pIVar22->CurrentWindowStack).Data = __dest_00;
    (pIVar22->CurrentWindowStack).Capacity = (int)uVar37;
  }
  (pIVar22->CurrentWindowStack).Size = 0;
  iVar36 = (pIVar22->BeginPopupStack).Capacity;
  if (iVar36 < 0) {
    uVar49 = iVar36 / 2 + iVar36;
    uVar37 = 0;
    if (0 < (int)uVar49) {
      uVar37 = (ulong)uVar49;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar37 * 0x30,GImAllocatorUserData);
    pIVar18 = (pIVar22->BeginPopupStack).Data;
    if (pIVar18 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar18,(long)(pIVar22->BeginPopupStack).Size * 0x30);
      pIVar18 = (pIVar22->BeginPopupStack).Data;
      if ((pIVar18 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar22->BeginPopupStack).Data = __dest_01;
    (pIVar22->BeginPopupStack).Capacity = (int)uVar37;
  }
  (pIVar22->BeginPopupStack).Size = 0;
  iVar36 = (pIVar22->ItemFlagsStack).Capacity;
  if (iVar36 < 0) {
    uVar49 = iVar36 / 2 + iVar36;
    uVar37 = 0;
    if (0 < (int)uVar49) {
      uVar37 = (ulong)uVar49;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    piVar30 = (int *)(*GImAllocatorAllocFunc)(uVar37 * 4,GImAllocatorUserData);
    piVar19 = (pIVar22->ItemFlagsStack).Data;
    if (piVar19 != (int *)0x0) {
      memcpy(piVar30,piVar19,(long)(pIVar22->ItemFlagsStack).Size << 2);
      piVar19 = (pIVar22->ItemFlagsStack).Data;
      if ((piVar19 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar19,GImAllocatorUserData);
    }
    (pIVar22->ItemFlagsStack).Data = piVar30;
    (pIVar22->ItemFlagsStack).Capacity = (int)uVar37;
  }
  (pIVar22->ItemFlagsStack).Size = 0;
  if ((pIVar22->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    piVar30 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar19 = (pIVar22->ItemFlagsStack).Data;
    if (piVar19 != (int *)0x0) {
      memcpy(piVar30,piVar19,(long)(pIVar22->ItemFlagsStack).Size << 2);
      piVar19 = (pIVar22->ItemFlagsStack).Data;
      if ((piVar19 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar19,GImAllocatorUserData);
    }
    (pIVar22->ItemFlagsStack).Data = piVar30;
    (pIVar22->ItemFlagsStack).Capacity = 8;
  }
  (pIVar22->ItemFlagsStack).Data[(pIVar22->ItemFlagsStack).Size] = 0;
  (pIVar22->ItemFlagsStack).Size = (pIVar22->ItemFlagsStack).Size + 1;
  iVar36 = (pIVar22->GroupStack).Capacity;
  if (iVar36 < 0) {
    uVar49 = iVar36 / 2 + iVar36;
    uVar37 = 0;
    if (0 < (int)uVar49) {
      uVar37 = (ulong)uVar49;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar37 * 0x30,GImAllocatorUserData);
    pIVar20 = (pIVar22->GroupStack).Data;
    if (pIVar20 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar20,(long)(pIVar22->GroupStack).Size * 0x30);
      pIVar20 = (pIVar22->GroupStack).Data;
      if ((pIVar20 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar22->GroupStack).Data = __dest_02;
    (pIVar22->GroupStack).Capacity = (int)uVar37;
  }
  (pIVar22->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar22->NavWindow,false);
  pIVar23 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar23->DebugItemPickerActive == true) {
    uVar49 = pIVar23->HoveredIdPreviousFrame;
    pIVar23->MouseCursor = 7;
    iVar36 = (pIVar23->IO).KeyMap[0xe];
    if ((-1 < iVar36) && (bVar27 = IsKeyPressed(iVar36,true), bVar27)) {
      pIVar23->DebugItemPickerActive = false;
    }
    pIVar24 = GImGui;
    if (uVar49 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar23->DebugItemPickerBreakId = uVar49;
      pIVar23->DebugItemPickerActive = false;
    }
    pIVar6 = &pIVar24->NextWindowData;
    *(byte *)&pIVar6->Flags = (byte)pIVar6->Flags | 0x40;
    (pIVar24->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar49);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar49 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar22->WithinFrameScopeWithImplicitWindow = true;
  pIVar23 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar23->NextWindowData).SizeVal.x = 400.0;
  (pIVar23->NextWindowData).SizeVal.y = 400.0;
  (pIVar23->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar22->CurrentWindow->IsFallbackWindow != false) {
    if (0 < (pIVar22->Hooks).Size) {
      lVar43 = 0;
      lVar46 = 0;
      do {
        pIVar12 = (pIVar22->Hooks).Data;
        if (*(int *)(pIVar12 + lVar43 + 4) == 1) {
          (**(code **)(pIVar12 + lVar43 + 0x10))(pIVar22,pIVar12 + lVar43);
        }
        lVar46 = lVar46 + 1;
        lVar43 = lVar43 + 0x20;
      } while (lVar46 < (pIVar22->Hooks).Size);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                ,0x1000,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempDataStack.Size; i++)
        if (g.TablesTempDataStack[i].LastTimeActive >= 0.0f && g.TablesTempDataStack[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempDataStack[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}